

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O2

void lws_service_do_ripe_rxflow(lws_context_per_thread *pt)

{
  lws *wsi;
  lws_dll2 *plVar1;
  int iVar2;
  lws_dll2 *plVar3;
  pollfd pfd;
  
  plVar1 = (pt->dll_buflist_owner).head;
  if (plVar1 != (lws_dll2 *)0x0) {
    while (plVar3 = plVar1, plVar3 != (lws_dll2 *)0x0) {
      plVar1 = plVar3->next;
      wsi = (lws *)(plVar3 + -0xf);
      pfd.fd = -1;
      pfd.events = 1;
      pfd.revents = 1;
      _lws_log(0x10,"%s: rxflow processing: %p fc=%d, 0x%lx\n","lws_service_do_ripe_rxflow",wsi,
               (ulong)(*(char *)&plVar3[0x10].next != '\0'),
               (ulong)*(uint *)((long)&plVar3[0xe].next + 4));
      if ((*(char *)&plVar3[0x10].next == '\0') &&
         (*(short *)((long)&plVar3[0xe].next + 4) != 0x110)) {
        pt->field_0x187 = pt->field_0x187 | 2;
        iVar2 = (*(code *)plVar3[7].owner[2].head)(pt,wsi,&pfd);
        if (iVar2 == 6) {
          lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"close_and_handled");
        }
        pt->field_0x187 = pt->field_0x187 & 0xfd;
      }
    }
  }
  return;
}

Assistant:

void
lws_service_do_ripe_rxflow(struct lws_context_per_thread *pt)
{
	struct lws_pollfd pfd;

	if (!pt->dll_buflist_owner.head)
		return;

	/*
	 * service all guys with pending rxflow that reached a state they can
	 * accept the pending data
	 */

	lws_pt_lock(pt, __func__);

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		pfd.events = LWS_POLLIN;
		pfd.revents = LWS_POLLIN;
		pfd.fd = -1;

		lwsl_debug("%s: rxflow processing: %p fc=%d, 0x%lx\n", __func__,
			   wsi, lws_is_flowcontrolled(wsi),
			   (unsigned long)wsi->wsistate);

		if (!lws_is_flowcontrolled(wsi) &&
		    lwsi_state(wsi) != LRS_DEFERRING_ACTION) {
			pt->inside_lws_service = 1;

			if ((wsi->role_ops->handle_POLLIN)(pt, wsi, &pfd) ==
						   LWS_HPI_RET_PLEASE_CLOSE_ME)
				lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
						"close_and_handled");
			pt->inside_lws_service = 0;
		}

	} lws_end_foreach_dll_safe(d, d1);

	lws_pt_unlock(pt);
}